

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::Writer::initializeLogger(Writer *this,string *loggerId,bool lookup,bool needLock)

{
  undefined *puVar1;
  bool bVar2;
  EnumType EVar3;
  uint uVar4;
  element_type *peVar5;
  Logger *pLVar6;
  RegisteredLoggers *pRVar7;
  byte in_CL;
  byte in_DL;
  long in_RDI;
  bool in_stack_0000011f;
  string *in_stack_00000120;
  RegisteredLoggers *in_stack_00000128;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 uVar8;
  undefined2 in_stack_fffffffffffffe8c;
  DispatchAction in_stack_fffffffffffffe8e;
  Logger *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  Level level;
  Writer *this_00;
  VerboseLevel in_stack_fffffffffffffec0;
  Writer local_e8;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [38];
  byte local_12;
  byte local_11;
  
  level = (Level)((ulong)in_stack_fffffffffffffea8 >> 0x30);
  local_11 = in_DL & 1;
  local_12 = in_CL & 1;
  if (local_11 != 0) {
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d4c94);
    Storage::registeredLoggers(peVar5);
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d4cbd);
    Storage::hasFlag((Storage *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
    pLVar6 = RegisteredLoggers::get(in_stack_00000128,in_stack_00000120,in_stack_0000011f);
    *(Logger **)(in_RDI + 0x30) = pLVar6;
  }
  if (*(long *)(in_RDI + 0x30) == 0) {
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d4d15);
    (**(peVar5->super_ThreadSafe)._vptr_ThreadSafe)();
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d4d2a);
    Storage::registeredLoggers(peVar5);
    puVar1 = consts::kDefaultLoggerId;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,puVar1,&local_39);
    bVar2 = RegisteredLoggers::has
                      ((RegisteredLoggers *)in_stack_fffffffffffffe90,
                       (string *)
                       CONCAT26(in_stack_fffffffffffffe8e,
                                CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d4dc3);
      pRVar7 = Storage::registeredLoggers(peVar5);
      puVar1 = consts::kDefaultLoggerId;
      in_stack_fffffffffffffec0 = (VerboseLevel)pRVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,puVar1,&local_71);
      RegisteredLoggers::get(in_stack_00000128,in_stack_00000120,in_stack_0000011f);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    peVar5 = std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d4edd);
    (*(peVar5->super_ThreadSafe)._vptr_ThreadSafe[1])();
    uVar8 = 0;
    this_00 = &local_e8;
    Writer(this_00,level,in_stack_fffffffffffffea0,
           CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
           (char *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e,in_stack_fffffffffffffec0);
    construct(this_00,1,consts::kDefaultLoggerId);
    operator<<((Writer *)in_stack_fffffffffffffe90,
               (char (*) [9])
               CONCAT26(in_stack_fffffffffffffe8e,CONCAT24(in_stack_fffffffffffffe8c,uVar8)));
    operator<<((Writer *)in_stack_fffffffffffffe90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffe8e,CONCAT24(in_stack_fffffffffffffe8c,uVar8)));
    operator<<((Writer *)in_stack_fffffffffffffe90,
               (char (*) [25])
               CONCAT26(in_stack_fffffffffffffe8e,CONCAT24(in_stack_fffffffffffffe8c,uVar8)));
    ~Writer((Writer *)in_stack_fffffffffffffe90);
    *(undefined1 *)(in_RDI + 0x38) = 0;
  }
  else {
    if ((local_12 & 1) != 0) {
      (**(code **)**(undefined8 **)(in_RDI + 0x30))();
    }
    std::__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1d4ff1);
    bVar2 = Storage::hasFlag((Storage *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
    if (bVar2) {
      if (*(short *)(in_RDI + 8) == 0x40) {
        bVar2 = Logger::enabled(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
      }
      else {
        EVar3 = LevelHelper::castToInt(*(Level *)(in_RDI + 8));
        uVar4 = (uint)EVar3;
        peVar5 = std::
                 __shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<el::base::Storage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1d5055);
        EVar3 = LevelHelper::castToInt(peVar5->m_loggingLevel);
        bVar2 = (int)(uint)EVar3 <= (int)uVar4;
      }
      *(bool *)(in_RDI + 0x38) = bVar2;
    }
    else {
      bVar2 = Logger::enabled(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
      *(bool *)(in_RDI + 0x38) = bVar2;
    }
  }
  return;
}

Assistant:

void initializeLogger(const std::string& loggerId, bool lookup = true, bool needLock = true) {
    if (lookup) {
      m_logger = ELPP->registeredLoggers()->get(loggerId, ELPP->hasFlag(LoggingFlag::CreateLoggerAutomatically));
    }
    if (m_logger == nullptr) {
      ELPP->acquireLock();
      if (!ELPP->registeredLoggers()->has(std::string(base::consts::kDefaultLoggerId))) {
        // Somehow default logger has been unregistered. Not good! Register again
        ELPP->registeredLoggers()->get(std::string(base::consts::kDefaultLoggerId));
      }
      ELPP->releaseLock();  // Need to unlock it for next writer
      Writer(Level::Debug, m_file, m_line, m_func).construct(1, base::consts::kDefaultLoggerId)
          << "Logger [" << loggerId << "] is not registered yet!";
      m_proceed = false;
    } else {
      if (needLock) {
        m_logger->acquireLock();  // This should not be unlocked by checking m_proceed because
        // m_proceed can be changed by lines below
      }
      if (ELPP->hasFlag(LoggingFlag::HierarchicalLogging)) {
        m_proceed = m_level == Level::Verbose ? m_logger->enabled(m_level) :
                    LevelHelper::castToInt(m_level) >= LevelHelper::castToInt(ELPP->m_loggingLevel);
      } else {
        m_proceed = m_logger->enabled(m_level);
      }
    }
  }